

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O0

bool __thiscall tinyusdz::primvar::PrimVar::has_value(PrimVar *this)

{
  uint32_t uVar1;
  bool local_21;
  PrimVar *this_local;
  
  if ((this->_blocked & 1U) == 0) {
    uVar1 = tinyusdz::value::Value::type_id(&this->_value);
    local_21 = false;
    if (uVar1 != 0) {
      uVar1 = tinyusdz::value::Value::type_id(&this->_value);
      local_21 = uVar1 != 1;
    }
    this_local._7_1_ = local_21;
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool has_value() const {
    // ValueBlock is treated as having a value.
    if (_blocked) {
      return true;
    }
    return (_value.type_id() != value::TypeId::TYPE_ID_INVALID) && (_value.type_id() != value::TypeId::TYPE_ID_NULL);
  }